

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_cmp(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *pTVar1;
  int opsize_00;
  TCGv_i32 src_00;
  TCGv_i32 dest;
  int opsize;
  TCGv_i32 reg;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  pTVar1 = s->uc->tcg_ctx;
  opsize_00 = insn_opsize((uint)insn);
  src_00 = gen_ea(env,s,insn,opsize_00,pTVar1->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                  (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (src_00 == pTVar1->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    dest = gen_extend(s,pTVar1->cpu_dregs[(int)((int)(uint)insn >> 9 & 7)],opsize_00,1);
    gen_update_cc_cmp(s,dest,src_00,opsize_00);
  }
  return;
}

Assistant:

DISAS_INSN(cmp)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv reg;
    int opsize;

    opsize = insn_opsize(insn);
    SRC_EA(env, src, opsize, 1, NULL);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);
    gen_update_cc_cmp(s, reg, src, opsize);
}